

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LL.cpp
# Opt level: O1

bool __thiscall ll_grammar::GrammarLeft::get_first(GrammarLeft *this,int elemIndex)

{
  vector<int,std::allocator<int>> *this_00;
  pointer pvVar1;
  iterator __position;
  pointer pEVar2;
  pointer piVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  vector<int,_std::allocator<int>_> temp;
  int local_4c;
  vector<int,_std::allocator<int>_> local_48;
  
  if (elemIndex != -1) {
    pvVar1 = (this->first).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    __position._M_current =
         *(pointer *)
          ((long)&pvVar1[elemIndex].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data + 8);
    if (__position._M_current ==
        pvVar1[elemIndex].super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_4c = elemIndex;
      if ((this->elements).
          super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>._M_impl.
          super__Vector_impl_data._M_start[elemIndex].super_Elem.is_finally == true) {
        this_00 = (vector<int,std::allocator<int>> *)(pvVar1 + elemIndex);
        if (__position._M_current == *(int **)(this_00 + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (this_00,__position,&local_4c);
        }
        else {
          *__position._M_current = elemIndex;
          *(int **)(this_00 + 8) = __position._M_current + 1;
        }
      }
      else {
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        piVar3 = (this->first_temp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->first_temp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish != piVar3) {
          (this->first_temp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = piVar3;
        }
        lVar5 = (long)elemIndex;
        pEVar2 = (this->elements).
                 super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (*(pointer *)
             ((long)&pEVar2[lVar5].expression_of_set.
                     super__Vector_base<ll_grammar::ExpressLeft,_std::allocator<ll_grammar::ExpressLeft>_>
                     ._M_impl + 8) !=
            pEVar2[lVar5].expression_of_set.
            super__Vector_base<ll_grammar::ExpressLeft,_std::allocator<ll_grammar::ExpressLeft>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          uVar6 = 0;
          do {
            calculate_expression_first(this,(int)lVar5,(int)uVar6,&local_48,true);
            public_tool::connect_vector
                      ((this->first).
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + local_4c,&local_48);
            lVar5 = (long)local_4c;
            pEVar2 = (this->elements).
                     super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar6 = uVar6 + 1;
            uVar4 = ((long)*(pointer *)
                            ((long)&pEVar2[lVar5].expression_of_set.
                                    super__Vector_base<ll_grammar::ExpressLeft,_std::allocator<ll_grammar::ExpressLeft>_>
                                    ._M_impl + 8) -
                     *(long *)&pEVar2[lVar5].expression_of_set.
                               super__Vector_base<ll_grammar::ExpressLeft,_std::allocator<ll_grammar::ExpressLeft>_>
                               ._M_impl.super__Vector_impl_data >> 3) * -0x5555555555555555;
          } while (uVar6 <= uVar4 && uVar4 - uVar6 != 0);
        }
        piVar3 = (this->first_temp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->first_temp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish != piVar3) {
          uVar6 = 0;
          do {
            calculate_expression_first(this,local_4c,piVar3[uVar6],&local_48,false);
            public_tool::connect_vector
                      ((this->first).
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + local_4c,&local_48);
            uVar6 = uVar6 + 1;
            piVar3 = (this->first_temp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
          } while (uVar6 < (ulong)((long)(this->first_temp).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_finish - (long)piVar3 >> 2));
        }
        if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
    }
  }
  return elemIndex != -1;
}

Assistant:

bool GrammarLeft::get_first(int elemIndex){

    //空串
    if (elemIndex == -1) return false;

    //这个符号的first集合已经求出来了
    if (first[elemIndex].size() != 0) return true;

    //判断是不是终结符，是的话说明这个first可以直接求
    if (elements[elemIndex].is_finally){
        //是终结符,将自己添加就行
        first[elemIndex].push_back(elemIndex);
    }
    else
    {
        //不是终结符，需要计算这个非终结符的每一个表达式然后在添加上去
        //vector<int> t;
        vector<int> temp;
        this->first_temp.clear();//后续准备
        //计算这个产生式的表达式
        for (int i = 0; i < elements[elemIndex].expression_of_set.size(); i++){
            //计算第i个表达式
            calculate_expression_first(elemIndex, i, temp);
            connect_vector(first[elemIndex], temp);
        }
        //对于这种情况有没有可能出现：
        //A->TAb|c|T
        //T->@|t
        //进行递归了
        for (int i = 0; i < first_temp.size(); i++){
            calculate_expression_first(elemIndex, first_temp[i], temp, false);
            connect_vector(first[elemIndex], temp);
        }

    }

    return true;
}